

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

TextureCubemap * LoadTextureCubemap(TextureCubemap *__return_storage_ptr__,Image image,int layout)

{
  undefined1 auVar1 [16];
  void *__ptr;
  long lVar2;
  float *pfVar3;
  ulong uVar4;
  uint uVar5;
  undefined8 *puVar6;
  int size;
  int iVar7;
  float fVar8;
  int iVar11;
  long lVar12;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  int iVar17;
  Rectangle srcRec;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Image local_78;
  float local_58;
  undefined4 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  __return_storage_ptr__->id = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->mipmaps = 0;
  __return_storage_ptr__->format = 0;
  iVar7 = 0;
  if (layout == 0) {
    if (image.height < image.width) {
      layout = 2;
      iVar7 = image.height;
      if (image.width / 6 != image.height) {
        iVar7 = image.width + 3;
        if (-1 < image.width) {
          iVar7 = image.width;
        }
        iVar7 = iVar7 >> 2;
        layout = 4;
        if ((iVar7 != image.height / 3) &&
           (layout = 5, image.width < (int)((float)image.height * 1.85))) goto LAB_001402fd;
      }
    }
    else {
      if (image.height <= image.width) {
LAB_001402fd:
        TraceLog(4,"IMAGE: Failed to detect cubemap image layout");
        return __return_storage_ptr__;
      }
      layout = 1;
      iVar7 = image.width;
      if (image.height / 6 != image.width) {
        iVar11 = image.height + 3;
        if (-1 < image.height) {
          iVar11 = image.height;
        }
        layout = 3;
        iVar7 = image.width / 3;
        if (image.width / 3 != iVar11 >> 2) goto LAB_001402fd;
      }
    }
    __return_storage_ptr__->width = iVar7;
    __return_storage_ptr__->height = iVar7;
  }
  local_78.data = (void *)0x0;
  local_78.width = 0;
  local_78.height = 0;
  local_78.mipmaps = 0;
  local_78.format = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_48 = (float)iVar7;
  lVar2 = 0xc;
  do {
    *(undefined8 *)(&stack0xffffffffffffff1c + lVar2) = 0;
    *(float *)((long)&fStack_dc + lVar2) = local_48;
    *(float *)((long)&local_d8 + lVar2) = local_48;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x6c);
  local_58 = local_48;
  uStack_50 = 0;
  switch(layout) {
  case 1:
    local_78.mipmaps = (int)image._16_8_;
    local_78.format = SUB84(image._16_8_,4);
    local_78.data = image.data;
    local_78.width = (int)image._8_8_;
    local_78.height = SUB84(image._8_8_,4);
    pfVar3 = (float *)((long)&local_c8 + 4);
    lVar2 = 0;
    auVar15 = _DAT_00163250;
    do {
      if (SUB164(auVar15 ^ _DAT_0015d7b0,4) == -0x80000000 &&
          SUB164(auVar15 ^ _DAT_0015d7b0,0) < -0x7ffffffa) {
        pfVar3[-4] = (float)(int)lVar2 * local_48;
        *pfVar3 = (float)((int)lVar2 + 1) * local_48;
      }
      lVar2 = lVar2 + 2;
      lVar12 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar12 + 2;
      pfVar3 = pfVar3 + 8;
    } while (lVar2 != 6);
    goto switchD_0013febd_caseD_5;
  case 2:
    pfVar3 = (float *)&local_c8;
    lVar2 = 0;
    auVar9 = _DAT_00163250;
    do {
      if (SUB164(auVar9 ^ _DAT_0015d7b0,4) == -0x80000000 &&
          SUB164(auVar9 ^ _DAT_0015d7b0,0) < -0x7ffffffa) {
        pfVar3[-4] = (float)(int)lVar2 * local_48;
        *pfVar3 = (float)((int)lVar2 + 1) * local_48;
      }
      lVar2 = lVar2 + 2;
      lVar12 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar12 + 2;
      pfVar3 = pfVar3 + 8;
    } while (lVar2 != 6);
    break;
  case 3:
    local_c8 = CONCAT44(local_48 * 3.0,local_48);
    fVar8 = local_48 + local_48;
    local_98._0_4_ = 0.0;
    fVar16 = local_48;
    goto LAB_0014009f;
  case 4:
    local_c8 = (ulong)(uint)local_48 << 0x20;
    fVar8 = local_48 * 3.0;
    fVar16 = local_48 + local_48;
    local_98._0_4_ = local_48;
LAB_0014009f:
    local_a8 = CONCAT44(local_48 + local_48,local_48);
    local_98 = CONCAT44(local_48,(float)local_98);
    local_b8 = (ulong)(uint)local_48;
    local_d8 = CONCAT44(local_48,fVar16);
    local_88 = CONCAT44(local_48,fVar8);
    break;
  case 5:
    goto switchD_0013febd_caseD_5;
  }
  uVar5 = iVar7 * 6 * iVar7;
  local_78.data = calloc((long)(int)uVar5,4);
  auVar9 = _DAT_0015d7b0;
  if (0 < (int)uVar5) {
    lVar2 = (ulong)uVar5 - 1;
    auVar10._8_4_ = (int)lVar2;
    auVar10._0_8_ = lVar2;
    auVar10._12_4_ = (int)((ulong)lVar2 >> 0x20);
    uVar4 = 0;
    auVar10 = auVar10 ^ _DAT_0015d7b0;
    auVar13 = _DAT_00164b50;
    auVar14 = _DAT_00163250;
    do {
      auVar15 = auVar14 ^ auVar9;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar11 && auVar10._0_4_ < auVar15._0_4_ ||
                  iVar11 < auVar15._4_4_) & 1)) {
        *(undefined4 *)((long)local_78.data + uVar4 * 4) = 0xffff00ff;
      }
      if ((auVar15._12_4_ != auVar10._12_4_ || auVar15._8_4_ <= auVar10._8_4_) &&
          auVar15._12_4_ <= auVar10._12_4_) {
        *(undefined4 *)((long)local_78.data + uVar4 * 4 + 4) = 0xffff00ff;
      }
      auVar15 = auVar13 ^ auVar9;
      iVar17 = auVar15._4_4_;
      if (iVar17 <= iVar11 && (iVar17 != iVar11 || auVar15._0_4_ <= auVar10._0_4_)) {
        *(undefined4 *)((long)local_78.data + uVar4 * 4 + 8) = 0xffff00ff;
        *(undefined4 *)((long)local_78.data + uVar4 * 4 + 0xc) = 0xffff00ff;
      }
      uVar4 = uVar4 + 4;
      lVar2 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar2 + 4;
      lVar2 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar2 + 4;
    } while ((uVar5 + 3 & 0xfffffffc) != uVar4);
  }
  local_78.height = iVar7 * 6;
  local_78.width = iVar7;
  local_78.mipmaps = 1;
  local_78.format = 7;
  ImageFormat(&local_78,image.format);
  local_48 = local_58;
switchD_0013febd_caseD_5:
  fStack_44 = local_48;
  fStack_40 = local_48;
  fStack_3c = local_48;
  puVar6 = &uStack_d0;
  lVar2 = 0;
  fVar16 = local_48;
  do {
    auVar1._8_4_ = fStack_44;
    auVar1._4_4_ = local_48;
    srcRec._8_8_ = *puVar6;
    srcRec._0_8_ = puVar6[-1];
    auVar1._0_4_ = (float)(int)lVar2 * fVar16;
    auVar1._12_4_ = 0;
    ImageDraw(&local_78,image,srcRec,(Rectangle)(auVar1 << 0x20),(Color)0xffffffff);
    __ptr = local_78.data;
    lVar2 = lVar2 + 1;
    puVar6 = puVar6 + 2;
    fVar16 = local_58;
  } while (lVar2 != 6);
  uVar5 = rlLoadTextureCubemap(local_78.data,iVar7,local_78.format);
  __return_storage_ptr__->id = uVar5;
  if (uVar5 == 0) {
    TraceLog(4,"IMAGE: Failed to load cubemap image");
  }
  free(__ptr);
  return __return_storage_ptr__;
}

Assistant:

TextureCubemap LoadTextureCubemap(Image image, int layout)
{
    TextureCubemap cubemap = { 0 };

    if (layout == CUBEMAP_LAYOUT_AUTO_DETECT)      // Try to automatically guess layout type
    {
        // Check image width/height to determine the type of cubemap provided
        if (image.width > image.height)
        {
            if ((image.width/6) == image.height) { layout = CUBEMAP_LAYOUT_LINE_HORIZONTAL; cubemap.width = image.width/6; }
            else if ((image.width/4) == (image.height/3)) { layout = CUBEMAP_LAYOUT_CROSS_FOUR_BY_THREE; cubemap.width = image.width/4; }
            else if (image.width >= (int)((float)image.height*1.85f)) { layout = CUBEMAP_LAYOUT_PANORAMA; cubemap.width = image.width/4; }
        }
        else if (image.height > image.width)
        {
            if ((image.height/6) == image.width) { layout = CUBEMAP_LAYOUT_LINE_VERTICAL; cubemap.width = image.height/6; }
            else if ((image.width/3) == (image.height/4)) { layout = CUBEMAP_LAYOUT_CROSS_THREE_BY_FOUR; cubemap.width = image.width/3; }
        }

        cubemap.height = cubemap.width;
    }

    if (layout != CUBEMAP_LAYOUT_AUTO_DETECT)
    {
        int size = cubemap.width;

        Image faces = { 0 };                // Vertical column image
        Rectangle faceRecs[6] = { 0 };      // Face source rectangles
        for (int i = 0; i < 6; i++) faceRecs[i] = (Rectangle){ 0, 0, (float)size, (float)size };

        if (layout == CUBEMAP_LAYOUT_LINE_VERTICAL)
        {
            faces = image;
            for (int i = 0; i < 6; i++) faceRecs[i].y = (float)size*i;
        }
        else if (layout == CUBEMAP_LAYOUT_PANORAMA)
        {
            // TODO: Convert panorama image to square faces...
            // Ref: https://github.com/denivip/panorama/blob/master/panorama.cpp
        }
        else
        {
            if (layout == CUBEMAP_LAYOUT_LINE_HORIZONTAL) for (int i = 0; i < 6; i++) faceRecs[i].x = (float)size*i;
            else if (layout == CUBEMAP_LAYOUT_CROSS_THREE_BY_FOUR)
            {
                faceRecs[0].x = (float)size; faceRecs[0].y = (float)size;
                faceRecs[1].x = (float)size; faceRecs[1].y = (float)size*3;
                faceRecs[2].x = (float)size; faceRecs[2].y = 0;
                faceRecs[3].x = (float)size; faceRecs[3].y = (float)size*2;
                faceRecs[4].x = 0; faceRecs[4].y = (float)size;
                faceRecs[5].x = (float)size*2; faceRecs[5].y = (float)size;
            }
            else if (layout == CUBEMAP_LAYOUT_CROSS_FOUR_BY_THREE)
            {
                faceRecs[0].x = (float)size*2; faceRecs[0].y = (float)size;
                faceRecs[1].x = 0; faceRecs[1].y = (float)size;
                faceRecs[2].x = (float)size; faceRecs[2].y = 0;
                faceRecs[3].x = (float)size; faceRecs[3].y = (float)size*2;
                faceRecs[4].x = (float)size; faceRecs[4].y = (float)size;
                faceRecs[5].x = (float)size*3; faceRecs[5].y = (float)size;
            }

            // Convert image data to 6 faces in a vertical column, that's the optimum layout for loading
            faces = GenImageColor(size, size*6, MAGENTA);
            ImageFormat(&faces, image.format);

            // TODO: Image formating does not work with compressed textures!
        }

        for (int i = 0; i < 6; i++) ImageDraw(&faces, image, faceRecs[i], (Rectangle){ 0, (float)size*i, (float)size, (float)size }, WHITE);

        cubemap.id = rlLoadTextureCubemap(faces.data, size, faces.format);
        if (cubemap.id == 0) TRACELOG(LOG_WARNING, "IMAGE: Failed to load cubemap image");

        UnloadImage(faces);
    }
    else TRACELOG(LOG_WARNING, "IMAGE: Failed to detect cubemap image layout");

    return cubemap;
}